

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_send_message.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_4131e::mock_writer::mock_writer(mock_writer *this)

{
  descriptor<pstore::details::posix_descriptor_traits> local_38;
  _Function_base local_30;
  code *local_18;
  
  local_38.fd_ = -1;
  local_30._M_functor._8_8_ = 0;
  local_30._M_functor._M_unused._M_object = pstore::brokerface::writer::default_callback;
  local_18 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_30._M_manager = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  pstore::brokerface::writer::writer(&this->super_writer,(UI *)&local_38,(UI_STRING *)&local_30);
  std::_Function_base::~_Function_base(&local_30);
  pstore::details::descriptor<pstore::details::posix_descriptor_traits>::~descriptor(&local_38);
  (this->super_writer)._vptr_writer = (_func_int **)&PTR__mock_writer_00164640;
  testing::internal::FunctionMocker<bool_(const_pstore::brokerface::message_type_&)>::FunctionMocker
            (&this->gmock01_write_impl_36);
  return;
}

Assistant:

mock_writer ()
                : pstore::brokerface::writer (make_pipe ()) {}